

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjStore(jx9_value *pSrc,jx9_value *pDest)

{
  sxi32 local_24;
  jx9_hashmap *pjStack_20;
  sxi32 rc;
  jx9_hashmap *pMap;
  jx9_value *pDest_local;
  jx9_value *pSrc_local;
  
  pjStack_20 = (jx9_hashmap *)0x0;
  if ((pSrc->iFlags & 0x40U) != 0) {
    *(int *)((pSrc->x).iVal + 0x50) = *(int *)((pSrc->x).iVal + 0x50) + 1;
  }
  if ((pDest->iFlags & 0x40U) != 0) {
    pjStack_20 = (jx9_hashmap *)(pDest->x).pOther;
  }
  SyMemcpy(pSrc,pDest,0x14);
  local_24 = 0;
  if ((pSrc->sBlob).nByte == 0) {
    if ((pDest->sBlob).nByte != 0) {
      SyBlobRelease(&pDest->sBlob);
    }
  }
  else {
    SyBlobReset(&pDest->sBlob);
    local_24 = SyBlobDup(&pSrc->sBlob,&pDest->sBlob);
  }
  if (pjStack_20 != (jx9_hashmap *)0x0) {
    jx9HashmapUnref(pjStack_20);
  }
  return local_24;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjStore(jx9_value *pSrc, jx9_value *pDest)
{
	jx9_hashmap *pMap = 0;
	sxi32 rc;
	if( pSrc->iFlags & MEMOBJ_HASHMAP ){
		/* Increment reference count */
		((jx9_hashmap *)pSrc->x.pOther)->iRef++;
	}
	if( pDest->iFlags & MEMOBJ_HASHMAP ){
		pMap = (jx9_hashmap *)pDest->x.pOther;
	}
	SyMemcpy((const void *)&(*pSrc), &(*pDest), sizeof(jx9_value)-(sizeof(jx9_vm *)+sizeof(SyBlob)+sizeof(sxu32)));
	rc = SXRET_OK;
	if( SyBlobLength(&pSrc->sBlob) > 0 ){
		SyBlobReset(&pDest->sBlob);
		rc = SyBlobDup(&pSrc->sBlob, &pDest->sBlob);
	}else{
		if( SyBlobLength(&pDest->sBlob) > 0 ){
			SyBlobRelease(&pDest->sBlob);
		}
	}
	if( pMap ){
		jx9HashmapUnref(pMap);
	}
	return rc;
}